

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::verifyTimestamp
          (TestStatus *__return_storage_ptr__,TimestampTestInstance *this)

{
  long lVar1;
  uint uVar2;
  ulong uVar4;
  ulong uVar5;
  long *local_30;
  long local_28;
  long local_20 [2];
  ulong uVar3;
  
  lVar1 = (long)(this->m_stages).
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_stages).
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    uVar3 = 0;
    uVar4 = 0;
    do {
      if ((int)uVar4 != 0) {
        uVar5 = 0;
        do {
          if (this->m_timestampValues[uVar3] < this->m_timestampValues[uVar5]) {
            local_30 = local_20;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_30,
                       "Latter stage timestamp is smaller than the former stage timestamp.","");
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,local_30,
                       local_28 + (long)local_30);
            goto LAB_0046cb16;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      uVar2 = (int)uVar4 + 1;
      uVar3 = (ulong)uVar2;
      uVar4 = (ulong)uVar2;
    } while (uVar3 < (ulong)(lVar1 >> 2));
  }
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Timestamp increases steadily.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_30,local_28 + (long)local_30);
LAB_0046cb16:
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TimestampTestInstance::verifyTimestamp(void)
{
	for (deUint32 first = 0; first < m_stages.size(); first++)
	{
		for (deUint32 second = 0; second < first; second++)
		{
			if(m_timestampValues[first] < m_timestampValues[second])
			{
				return tcu::TestStatus::fail("Latter stage timestamp is smaller than the former stage timestamp.");
			}
		}
	}

	return tcu::TestStatus::pass("Timestamp increases steadily.");
}